

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Vec_Int_t *vCands;
  Vec_Int_t *vNewNodes;
  uint iObj;
  uint uVar1;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pPivot;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *__ptr;
  Sfm_Mit_t *pMit;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  timespec ts;
  
  pPars = p->pPars;
  pNtk = p->pNtk;
  Abc_NtkCleanMarkABC(pNtk);
  if (-1 < pPars->nNodesMax) {
    vCands = &p->vCands;
    vNewNodes = &p->vNewNodes;
    iVar4 = pPars->iNodeOne;
    iVar14 = 0;
    do {
      if (iVar4 == 0) {
        if (((p->pTim != (Sfm_Tim_t *)0x0) &&
            (iVar4 = Sfm_TimPriorityNodes(p->pTim,vCands,p->pPars->nTimeWin), iVar4 == 0)) ||
           ((p->pMit != (Sfm_Mit_t *)0x0 &&
            (iVar4 = Sfm_MitPriorityNodes(p->pMit,vCands,p->pPars->nTimeWin), iVar4 == 0)))) break;
        if (0 < (p->vCands).nSize) goto LAB_0052dea1;
      }
      else {
        __ptr = (p->vCands).pArray;
        if ((p->vCands).nCap < 1) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc(4);
          }
          else {
            __ptr = (int *)realloc(__ptr,4);
          }
          (p->vCands).pArray = __ptr;
          if (__ptr == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vCands->nCap = 1;
        }
        *__ptr = iVar4;
        (p->vCands).nSize = 1;
LAB_0052dea1:
        uVar13 = 0;
        do {
          iVar4 = (p->vCands).pArray[uVar13];
          if (((long)iVar4 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar4)) {
LAB_0052e5c1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pPivot = (Abc_Obj_t *)pVVar2->pArray[iVar4];
          if (pPivot != (Abc_Obj_t *)0x0) {
            iObj = pPivot->Id;
            if (p->pMit == (Sfm_Mit_t *)0x0) {
              iVar4 = Sfm_TimReadObjDelay(p->pTim,iObj);
            }
            else {
              iVar4 = Sfm_MitReadObjDelay(p->pMit,iObj);
            }
            if ((pPivot->field_0x14 & 0x10) != 0) {
              __assert_fail("pObj->fMarkA == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                            ,0x7d5,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
            }
            p->nNodesTried = p->nNodesTried + 1;
            iVar5 = clock_gettime(3,(timespec *)&ts);
            if (iVar5 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            iVar5 = Sfm_DecExtract(pNtk,pPars,pPivot,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                                   &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc
                                   ,p->pTim,p->pMit);
            p->nDivs = iVar5;
            iVar5 = clock_gettime(3,(timespec *)&ts);
            if (iVar5 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeWin = p->timeWin + lVar11 + lVar10;
            if ((1 < p->nDivs) &&
               ((pPars->nWinSizeMax == 0 || ((p->vObjGates).nSize <= pPars->nWinSizeMax)))) {
              p->nMffc = (p->vObjMffc).nSize;
              iVar5 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
              p->AreaMffc = iVar5;
              iVar5 = p->nDivs;
              iVar6 = p->nMaxDivs;
              if (p->nMaxDivs <= iVar5) {
                iVar6 = iVar5;
              }
              p->nMaxDivs = iVar6;
              p->nAllDivs = p->nAllDivs + (long)iVar5;
              p->iTarget = (pPivot->field_6).iTemp;
              iVar5 = (p->vObjGates).nSize;
              iVar6 = p->nMaxWin;
              if (p->nMaxWin <= iVar5) {
                iVar6 = iVar5;
              }
              p->nMaxWin = iVar6;
              p->nAllWin = p->nAllWin + (long)iVar5;
              iVar6 = clock_gettime(3,(timespec *)&ts);
              if (iVar6 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
              }
              iVar6 = Sfm_DecPrepareSolver(p);
              iVar7 = clock_gettime(3,(timespec *)&ts);
              if (iVar7 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeCnf = p->timeCnf + lVar11 + lVar10;
              if (iVar6 != 0) {
                iVar6 = clock_gettime(3,(timespec *)&ts);
                if (iVar6 < 0) {
                  lVar10 = 1;
                }
                else {
                  lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                iVar6 = Sfm_DecPeformDec3(p,pPivot);
                if (((pPars->fMoreEffort != 0) && (iVar6 < 0)) &&
                   (uVar12 = (ulong)(p->vObjInMffc).nSize, 0 < (long)uVar12)) {
                  do {
                    if ((long)(p->vObjInMffc).nSize < (long)uVar12) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    p->iUseThis = (p->vObjInMffc).pArray[uVar12 - 1];
                    iVar6 = Sfm_DecPeformDec3(p,pPivot);
                    p->iUseThis = -1;
                    if (-1 < iVar6) {
                      p->nEfforts = p->nEfforts + 1;
                      break;
                    }
                    bVar15 = 1 < uVar12;
                    uVar12 = uVar12 - 1;
                  } while (bVar15);
                }
                if (p->pPars->fVeryVerbose != 0) {
                  puts("\n");
                }
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar11 = -1;
                }
                else {
                  lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                p->timeSat = p->timeSat + lVar11 + lVar10;
                if (-1 < iVar6) {
                  iVar6 = (p->vObjGates).nSize;
                  if (iVar6 <= iVar5) {
                    __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                  ,0x811,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                  }
                  if (2 < iVar6 - iVar5) {
                    __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                  ,0x812,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                  }
                  p->nNodesChanged = p->nNodesChanged + 1;
                  Abc_NtkCountStats(p,iVar5);
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    pMit = (Sfm_Mit_t *)0x0;
                  }
                  else {
                    Sfm_MitUpdateLoad(p->pMit,&p->vGateMffc,0);
                    pMit = p->pMit;
                  }
                  Sfm_DecInsert(pNtk,pPivot,iVar5,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                                &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,vNewNodes,
                                pMit);
                  if (p->pMit != (Sfm_Mit_t *)0x0) {
                    Sfm_MitUpdateLoad(p->pMit,vNewNodes,1);
                  }
                  iVar5 = clock_gettime(3,(timespec *)&ts);
                  if (iVar5 < 0) {
                    lVar10 = 1;
                  }
                  else {
                    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
                  }
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    Sfm_TimUpdateTiming(p->pTim,vNewNodes);
                  }
                  else {
                    Sfm_MitUpdateTiming(p->pMit,vNewNodes);
                  }
                  iVar5 = clock_gettime(3,(timespec *)&ts);
                  if (iVar5 < 0) {
                    lVar11 = -1;
                  }
                  else {
                    lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  p->timeTime = p->timeTime + lVar11 + lVar10;
                  lVar10 = (long)pNtk->vObjs->nSize;
                  if (lVar10 < 1) goto LAB_0052e5c1;
                  pvVar3 = pNtk->vObjs->pArray[lVar10 + -1];
                  if (((p->pMit == (Sfm_Mit_t *)0x0) && (iVar5 = p->DelayMin, iVar5 != 0)) &&
                     (iVar6 = Sfm_TimReadObjDelay(p->pTim,*(int *)((long)pvVar3 + 0x10)),
                     iVar5 != iVar6)) {
                    __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                  ,0x821,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                  }
                  if (pPars->fDelayVerbose != 0) {
                    uVar1 = (p->vCands).nSize;
                    iVar5 = p->pNtk->nObjCounts[7];
                    iVar6 = p->pNtk->vObjs->nSize;
                    iVar7 = *(int *)((long)pvVar3 + 0x10);
                    if (p->pMit == (Sfm_Mit_t *)0x0) {
                      iVar7 = Sfm_TimReadObjDelay(p->pTim,iVar7);
                    }
                    else {
                      iVar7 = Sfm_MitReadObjDelay(p->pMit,iVar7);
                    }
                    if (p->pMit == (Sfm_Mit_t *)0x0) {
                      iVar8 = Sfm_TimReadNtkDelay(p->pTim);
                    }
                    else {
                      iVar8 = Sfm_MitReadNtkDelay(p->pMit);
                    }
                    if (p->pMit == (Sfm_Mit_t *)0x0) {
                      fVar16 = 0.0;
                    }
                    else {
                      iVar9 = Sfm_MitReadNtkMinSlack(p->pMit);
                      fVar16 = (float)iVar9;
                    }
                    printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n"
                           ,SUB84(((double)(int)uVar1 * 100.0) / (double)iVar5,0),
                           (double)((float)iVar4 / 1000.0),(double)((float)iVar7 / 1000.0),
                           (double)((float)iVar8 / 1000.0),(double)(fVar16 / 1000.0),(ulong)iObj,
                           iVar6,uVar13 & 0xffffffff,(ulong)uVar1);
                  }
                  break;
                }
              }
            }
            pPivot->field_0x14 = pPivot->field_0x14 | 0x10;
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)(p->vCands).nSize);
      }
      if (pPars->iNodeOne != 0) break;
      iVar14 = iVar14 + 1;
      iVar4 = 0;
    } while (iVar14 < pPars->nNodesMax || pPars->nNodesMax == 0);
  }
  Abc_NtkCleanMarkABC(pNtk);
  return;
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vGateMffc, 0 ); // assuming &p->vGateMffc contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vNewNodes, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vNewNodes, 1 ); // assuming &p->vNewNodes contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vNewNodes );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vNewNodes );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    Scl_Int2Flt(DelayOld), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))), 
                    Scl_Int2Flt(Sfm_ManReadNtkDelay(p)), Scl_Int2Flt(Sfm_ManReadNtkMinSlack(p)) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}